

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger(Parser *this,int *output,char *error)

{
  uint64 __s;
  bool bVar1;
  Token *pTVar2;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  uint64 local_30;
  uint64 value;
  char *error_local;
  int *output_local;
  Parser *this_local;
  
  value = (uint64)error;
  error_local = (char *)output;
  output_local = (int *)this;
  bVar1 = LookingAtType(this,TYPE_INTEGER);
  __s = value;
  if (bVar1) {
    local_30 = 0;
    pTVar2 = io::Tokenizer::current(this->input_);
    bVar1 = io::Tokenizer::ParseInteger(&pTVar2->text,0x7fffffff,&local_30);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Integer out of range.",&local_51);
      AddError(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    *(int *)error_local = (int)local_30;
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,(char *)__s,&local_89);
    AddError(this,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ConsumeInteger(int* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    uint64 value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text,
                                     kint32max, &value)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
    }
    *output = value;
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}